

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EasyScreenCapturerLinux.cpp
# Opt level: O0

StatusCode __thiscall
media::EasyScreenCapturerLinux::SaveBmpBitsAsFile
          (EasyScreenCapturerLinux *this,string *fileName,CaptureBmpData *bmp)

{
  char *__filename;
  element_type *__ptr;
  undefined2 local_36;
  uint32_t dwWriten;
  undefined2 local_30;
  BITMAPFILEHEADER bmpFileHeader;
  FILE *outfile;
  CaptureBmpData *bmp_local;
  string *fileName_local;
  EasyScreenCapturerLinux *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  bmpFileHeader._6_8_ = fopen(__filename,"wb");
  local_30 = 0;
  bmpFileHeader.bfType = 0;
  dwWriten = (bmp->m_headerInfo).biSizeImage + 0x36;
  local_36 = 0x4d42;
  bmpFileHeader.bfSize = 0x36;
  fwrite(&local_36,1,0xe,(FILE *)bmpFileHeader._6_8_);
  fwrite(&bmp->m_headerInfo,1,0x28,(FILE *)bmpFileHeader._6_8_);
  __ptr = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)bmp);
  fwrite(__ptr,1,(ulong)(bmp->m_headerInfo).biSizeImage,(FILE *)bmpFileHeader._6_8_);
  fclose((FILE *)bmpFileHeader._6_8_);
  return CAPTURE_OK;
}

Assistant:

StatusCode EasyScreenCapturerLinux::SaveBmpBitsAsFile(
    const std::string &fileName, const CaptureBmpData &bmp)
{
  FILE *outfile = fopen(fileName.c_str(), "wb");

  BITMAPFILEHEADER bmpFileHeader;
  bmpFileHeader.bfReserved1 = 0;
  bmpFileHeader.bfReserved2 = 0;

  bmpFileHeader.bfSize = sizeof(BITMAPFILEHEADER) + sizeof(BITMAPINFOHEADER) +
                         bmp.m_headerInfo.biSizeImage;
  bmpFileHeader.bfType = 'MB';
  bmpFileHeader.bfOffBits = sizeof(BITMAPFILEHEADER) + sizeof(BITMAPINFOHEADER);
  uint32_t dwWriten;
  fwrite(&bmpFileHeader, sizeof(char), sizeof(BITMAPFILEHEADER), outfile);
  fwrite(&bmp.m_headerInfo, sizeof(char), sizeof(BITMAPINFOHEADER), outfile);
  fwrite(bmp.m_pixels.get(), sizeof(char), bmp.m_headerInfo.biSizeImage, outfile);
  fclose(outfile);
  outfile = NULL;
  return StatusCode::CAPTURE_OK;
}